

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadScans(string *tempdir)

{
  exr_coding_channel_info_t *peVar1;
  int iVar2;
  uint uVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s_00;
  pointer __p;
  ostream *poVar4;
  ostream *poVar5;
  undefined8 extraout_RAX;
  exr_decode_pipeline_t *in_RCX;
  char *pcVar6;
  char *pcVar7;
  exr_context_t f;
  int32_t ccount;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> zptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rptr;
  exr_attr_box2i_t dw;
  uint64_t pchunksz;
  exr_chunk_info_t cinfo;
  string fn;
  void *local_260;
  code *local_258;
  void *local_250;
  size_t sStack_248;
  void *local_240;
  size_t sStack_238;
  int32_t *local_230;
  size_t sStack_228;
  void *local_220;
  size_t sStack_218;
  void *local_210;
  size_t sStack_208;
  _func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *local_200;
  exr_decode_pipeline_t decoder;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&decoder);
  local_210 = (void *)0x0;
  local_220 = (void *)0x0;
  sStack_218 = 0;
  local_230 = (int32_t *)0x0;
  sStack_228 = 0;
  local_240 = (void *)0x0;
  sStack_238 = 0;
  local_250 = (void *)0x0;
  sStack_248 = 0;
  local_200 = (_func_void_ptr_exr_transcoding_pipeline_buffer_id_t_size_t *)0x0;
  local_260 = (void *)0x68;
  sStack_208 = 0xbf800000fffffffe;
  local_258 = err_cb;
  std::__cxx11::string::append((char *)&fn);
  iVar2 = exr_start_read(&f,fn._M_dataplus._M_p,&local_260);
  if (iVar2 == 0) {
    iVar2 = exr_get_chunk_count(0,0,&ccount);
    if (iVar2 != 2) goto LAB_0012ca6b;
    uVar3 = exr_get_chunk_count(f,0xffffffffffffffff,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012cb0b;
    uVar3 = exr_get_chunk_count(f,0xb,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012cbab;
    uVar3 = exr_get_chunk_count(f,0,0);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012cc4b;
    uVar3 = exr_get_chunk_count(f,0,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012cceb;
    iVar2 = exr_get_scanlines_per_chunk(0,0,&ccount);
    if (iVar2 != 2) goto LAB_0012cd4c;
    uVar3 = exr_get_scanlines_per_chunk(f,0xffffffffffffffff,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012cdec;
    uVar3 = exr_get_scanlines_per_chunk(f,0xb,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012ce8c;
    uVar3 = exr_get_scanlines_per_chunk(f,0,0);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012cf2c;
    uVar3 = exr_get_scanlines_per_chunk(f,0,&ccount);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012cfcc;
    iVar2 = 0;
    if (ccount != 1) goto LAB_0012d02d;
    iVar2 = exr_get_data_window(0,0,&dw);
    if (iVar2 != 2) goto LAB_0012d045;
    uVar3 = exr_get_data_window(f,0xffffffffffffffff,&dw);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012d0e5;
    uVar3 = exr_get_data_window(f,1,&dw);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012d185;
    uVar3 = exr_get_data_window(f,0,0);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012d225;
    uVar3 = exr_get_data_window(f,0,&dw);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012d2c5;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    iVar2 = exr_read_scanline_chunk_info(0,0,0x2a);
    if (iVar2 != 2) goto LAB_0012d326;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    uVar3 = exr_read_scanline_chunk_info(f,0xffffffffffffffff,0x2a);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012d3c6;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    uVar3 = exr_read_scanline_chunk_info(f,1,0x2a);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 4) goto LAB_0012d466;
    in_RCX = (exr_decode_pipeline_t *)0x0;
    uVar3 = exr_read_scanline_chunk_info(f,0,0x2a);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012d506;
    in_RCX = (exr_decode_pipeline_t *)0x2;
    uVar3 = exr_read_tile_chunk_info(f,0,4,2,0,0,(exr_decode_pipeline_t *)&cinfo);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0x13) goto LAB_0012d5a6;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    uVar3 = exr_read_scanline_chunk_info(f,0,dw.min.field_0.field_0.y + -1);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012d646;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    uVar3 = exr_read_scanline_chunk_info(f,0,dw.max.field_0.field_0.y + 1);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 3) goto LAB_0012d6e6;
    in_RCX = (exr_decode_pipeline_t *)&cinfo;
    uVar3 = exr_read_scanline_chunk_info(f,0,dw.min.field_0.field_0.y);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012d786;
    uVar3 = exr_get_chunk_unpacked_size(f,0);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012d7e7;
    if (cinfo.type != '\0') goto LAB_0012d848;
    if (cinfo.compression != '\0') {
      pcVar6 = (char *)0x127;
      pcVar7 = "cinfo.compression == EXR_COMPRESSION_NONE";
      goto LAB_0012d89a;
    }
    if (cinfo.packed_size != 0) {
      pcVar6 = (char *)0x128;
      pcVar7 = "cinfo.packed_size == pchunksz";
      goto LAB_0012d89a;
    }
    if (cinfo.unpacked_size != 0) {
      pcVar6 = (char *)0x129;
      pcVar7 = "cinfo.unpacked_size == pchunksz";
      goto LAB_0012d89a;
    }
    if (cinfo.sample_count_data_offset != 0) {
      pcVar6 = (char *)0x12a;
      pcVar7 = "cinfo.sample_count_data_offset == 0";
      goto LAB_0012d89a;
    }
    if (cinfo.sample_count_table_size != 0) {
      pcVar6 = (char *)0x12b;
      pcVar7 = "cinfo.sample_count_table_size == 0";
      goto LAB_0012d89a;
    }
    in_RCX = &decoder;
    uVar3 = exr_decoding_initialize(f,0,&cinfo);
    peVar1 = decoder.channels;
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012d8a6;
    if (decoder.channel_count != 2) goto LAB_0012d907;
    pcVar6 = (char *)0x131;
    pcVar7 = "!strcmp (decoder.channels[0].channel_name, \"R\")";
    if ((*(decoder.channels)->channel_name != 'R') || ((decoder.channels)->channel_name[1] != '\0'))
    goto LAB_0012d9c4;
    if ((decoder.channels)->bytes_per_element != '\x02') {
      pcVar6 = (char *)0x132;
      pcVar7 = "decoder.channels[0].bytes_per_element == 2";
      goto LAB_0012d9c4;
    }
    if ((decoder.channels)->data_type != 1) {
      pcVar6 = (char *)0x133;
      pcVar7 = "decoder.channels[0].data_type == EXR_PIXEL_HALF";
      goto LAB_0012d9c4;
    }
    if ((decoder.channels)->width != 0xb2) {
      pcVar6 = (char *)0x134;
      pcVar7 = "decoder.channels[0].width == 178";
      goto LAB_0012d9c4;
    }
    if ((decoder.channels)->height != 1) {
      pcVar6 = (char *)0x135;
      pcVar7 = "decoder.channels[0].height == 1";
      goto LAB_0012d9c4;
    }
    if ((decoder.channels)->x_samples != 1) {
      pcVar6 = (char *)0x136;
      pcVar7 = "decoder.channels[0].x_samples == 1";
      goto LAB_0012d9c4;
    }
    if ((decoder.channels)->y_samples != 1) {
      pcVar6 = (char *)0x137;
      pcVar7 = "decoder.channels[0].y_samples == 1";
      goto LAB_0012d9c4;
    }
    pcVar6 = (char *)0x138;
    pcVar7 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
    if ((*decoder.channels[1].channel_name != 'Z') || (decoder.channels[1].channel_name[1] != '\0'))
    goto LAB_0012d9c4;
    if (decoder.channels[1].bytes_per_element != '\x04') {
      pcVar6 = (char *)0x139;
      pcVar7 = "decoder.channels[1].bytes_per_element == 4";
      goto LAB_0012d9c4;
    }
    if (decoder.channels[1].data_type != 2) {
      pcVar6 = (char *)0x13a;
      pcVar7 = "decoder.channels[1].data_type == EXR_PIXEL_FLOAT";
      goto LAB_0012d9c4;
    }
    if (decoder.channels[1].width != 0xb2) {
      pcVar6 = (char *)0x13b;
      pcVar7 = "decoder.channels[1].width == 178";
      goto LAB_0012d9c4;
    }
    if (decoder.channels[1].height != 1) {
      pcVar6 = (char *)0x13c;
      pcVar7 = "decoder.channels[1].height == 1";
      goto LAB_0012d9c4;
    }
    if (decoder.channels[1].x_samples != 1) {
      pcVar6 = (char *)0x13d;
      pcVar7 = "decoder.channels[1].x_samples == 1";
      goto LAB_0012d9c4;
    }
    if (decoder.channels[1].y_samples != 1) {
      pcVar6 = (char *)0x13e;
      pcVar7 = "decoder.channels[1].y_samples == 1";
      goto LAB_0012d9c4;
    }
    __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0x164);
    rptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0x2c8);
    zptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xff,0x164);
    memset((void *)__s_00.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xff,0x2c8);
    (peVar1->field_12).decode_to_ptr =
         (uint8_t *)
         __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    peVar1->user_pixel_stride = 2;
    peVar1->user_line_stride = 0x164;
    peVar1[1].field_12.decode_to_ptr =
         (uint8_t *)
         __s_00.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    peVar1[1].user_pixel_stride = 4;
    peVar1[1].user_line_stride = 0x2c8;
    uVar3 = exr_decoding_choose_default_routines(f,0,&decoder);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012d9d0;
    uVar3 = exr_decoding_run(f,0,&decoder);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012da31;
    if (decoder.packed_buffer != (void *)0x0) goto LAB_0012da92;
    if (decoder.unpacked_buffer != (void *)0x0) {
      pcVar6 = (char *)0x152;
      pcVar7 = "decoder.unpacked_buffer == __null";
      goto LAB_0012daac;
    }
    if (*(short *)rptr._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0)
    goto LAB_0012dab8;
    if (1e-06 <= ABS(*(float *)zptr._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                     -0.101991)) {
      pcVar6 = (char *)0x157;
      pcVar7 = "fabsf (*curz - 0.101991f) < 0.000001f";
      goto LAB_0012dad2;
    }
    uVar3 = exr_decoding_destroy(f,&decoder);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012dade;
    in_RCX = &decoder;
    uVar3 = exr_decoding_initialize(f,0,&cinfo);
    poVar5 = (ostream *)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0012db3f;
    __p = (pointer)operator_new__(0x2c8);
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&rptr,__p);
    (decoder.channels)->field_12 =
         (anon_union_8_2_47425d48_for_exr_coding_channel_info_t_12)
         rptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (decoder.channels)->user_line_stride = 0x2c8;
    (decoder.channels)->user_bytes_per_element = 4;
    (decoder.channels)->user_data_type = 2;
    (decoder.channels)->user_pixel_stride = 4;
    decoder.channels[1].field_12 =
         (anon_union_8_2_47425d48_for_exr_coding_channel_info_t_12)
         zptr._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    decoder.channels[1].user_pixel_stride = 4;
    decoder.channels[1].user_line_stride = 0x2c8;
    uVar3 = exr_decoding_choose_default_routines(f,0);
    poVar5 = (ostream *)(ulong)uVar3;
    in_RCX = (exr_decode_pipeline_t *)decoder.channels;
    if (uVar3 != 0) goto LAB_0012dba0;
    uVar3 = exr_decoding_run(f,0,&decoder);
    poVar5 = (ostream *)(ulong)uVar3;
    in_RCX = (exr_decode_pipeline_t *)decoder.channels;
    if (uVar3 == 0) {
      iVar2 = exr_decoding_destroy(f,&decoder);
      in_RCX = (exr_decode_pipeline_t *)decoder.channels;
      if (iVar2 == 0) {
        exr_finish(&f);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&zptr);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&rptr);
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_0012dc62;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xe4,0x15740b,(char *)in_RCX);
LAB_0012ca6b:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0xe8,0x15740b,(char *)in_RCX);
LAB_0012cb0b:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0xea,0x15740b,(char *)in_RCX);
LAB_0012cbab:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0xec,0x15740b,(char *)in_RCX);
LAB_0012cc4b:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0xee,0x15740b,(char *)in_RCX);
LAB_0012cceb:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0xef,0x15740b,(char *)in_RCX);
LAB_0012cd4c:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_scanlines_per_chunk (__null, 0, &ccount)",(char *)0xf3,0x15740b,
                   (char *)in_RCX);
LAB_0012cdec:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_scanlines_per_chunk (f, -1, &ccount)",(char *)0xf6,0x15740b,
                   (char *)in_RCX);
LAB_0012ce8c:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_scanlines_per_chunk (f, 11, &ccount)",(char *)0xf9,0x15740b,
                   (char *)in_RCX);
LAB_0012cf2c:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, __null)",(char *)0xfb,0x15740b,(char *)in_RCX
                  );
LAB_0012cfcc:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0xfc,0x15740b,
                   (char *)in_RCX);
LAB_0012d02d:
    core_test_fail("ccount == 1",(char *)0xfd,0x15740b,(char *)in_RCX);
LAB_0012d045:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_data_window (__null, 0, &dw)",(char *)0x101,0x15740b,(char *)in_RCX);
LAB_0012d0e5:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_data_window (f, -1, &dw)",(char *)0x103,0x15740b,(char *)in_RCX);
LAB_0012d185:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_data_window (f, 1, &dw)",(char *)0x105,0x15740b,(char *)in_RCX);
LAB_0012d225:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_data_window (f, 0, __null)",(char *)0x107,0x15740b,(char *)in_RCX);
LAB_0012d2c5:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)poVar5;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_data_window (f, 0, &dw)",(char *)0x108,0x15740b,(char *)in_RCX);
LAB_0012d326:
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,2);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(2);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (__null, 0, 42, &cinfo)",(char *)0x10d,0x15740b,
                   (char *)in_RCX);
LAB_0012d3c6:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, -1, 42, &cinfo)",(char *)0x110,0x15740b,
                   (char *)in_RCX);
LAB_0012d466:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(4);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 1, 42, &cinfo)",(char *)0x113,0x15740b,
                   (char *)in_RCX);
LAB_0012d506:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, __null)",(char *)0x116,0x15740b,
                   (char *)in_RCX);
LAB_0012d5a6:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x13);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(0x13);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x11a,0x15740b,
                   (char *)in_RCX);
LAB_0012d646:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y - 1, &cinfo)",(char *)0x11e,
                   0x15740b,(char *)in_RCX);
LAB_0012d6e6:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar5 = std::operator<<(poVar4,pcVar6);
    poVar5 = std::operator<<(poVar5,"\n    expected: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(3);
    poVar4 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.max.y + 1, &cinfo)",(char *)0x121,
                   0x15740b,(char *)in_RCX);
LAB_0012d786:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y, &cinfo)",(char *)0x122,0x15740b,
                   (char *)in_RCX);
LAB_0012d7e7:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x125,0x15740b,
                   (char *)in_RCX);
LAB_0012d848:
    pcVar6 = (char *)0x126;
    pcVar7 = "cinfo.type == EXR_STORAGE_SCANLINE";
LAB_0012d89a:
    core_test_fail(pcVar7,pcVar6,0x15740b,(char *)in_RCX);
LAB_0012d8a6:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x12e,0x15740b,
                   (char *)in_RCX);
LAB_0012d907:
    pcVar6 = (char *)0x130;
    pcVar7 = "decoder.channel_count == 2";
LAB_0012d9c4:
    core_test_fail(pcVar7,pcVar6,0x15740b,(char *)in_RCX);
LAB_0012d9d0:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x14b,0x15740b,
                   (char *)in_RCX);
LAB_0012da31:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x14d,0x15740b,(char *)in_RCX);
LAB_0012da92:
    pcVar6 = (char *)0x150;
    pcVar7 = "decoder.packed_buffer == __null";
LAB_0012daac:
    core_test_fail(pcVar7,pcVar6,0x15740b,(char *)in_RCX);
LAB_0012dab8:
    pcVar6 = (char *)0x156;
    pcVar7 = "*curr == 0";
LAB_0012dad2:
    core_test_fail(pcVar7,pcVar6,0x15740b,(char *)in_RCX);
LAB_0012dade:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x159,0x15740b,(char *)in_RCX);
LAB_0012db3f:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x15b,0x15740b,
                   (char *)in_RCX);
LAB_0012dba0:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)poVar5);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x166,0x15740b,
                   (char *)in_RCX);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  iVar2 = (int)poVar5;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar6 = (char *)exr_get_default_error_message((ulong)poVar5 & 0xffffffff);
  poVar5 = std::operator<<(poVar4,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x168,0x15740b,(char *)in_RCX);
LAB_0012dc62:
  poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  poVar5 = std::operator<<(poVar5,") ");
  pcVar6 = (char *)exr_get_default_error_message(iVar2);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
  core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x16a,0x15740b,(char *)in_RCX);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&rptr);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadScans (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    int32_t ccount;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_chunk_count (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_chunk_count (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_chunk_count (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_chunk_count (f, 0, &ccount));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_get_scanlines_per_chunk (NULL, 0, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_scanlines_per_chunk (f, -1, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_get_scanlines_per_chunk (f, 11, &ccount));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_scanlines_per_chunk (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_scanlines_per_chunk (f, 0, &ccount));
    EXRCORE_TEST (ccount == 1);

    exr_attr_box2i_t dw;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_data_window (NULL, 0, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_data_window (f, -1, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE, exr_get_data_window (f, 1, &dw));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_data_window (f, 0, NULL));
    EXRCORE_TEST_RVAL (exr_get_data_window (f, 0, &dw));

    exr_chunk_info_t cinfo;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_read_scanline_chunk_info (NULL, 0, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_scanline_chunk_info (f, -1, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_ARGUMENT_OUT_OF_RANGE,
        exr_read_scanline_chunk_info (f, 1, 42, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, 42, NULL));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_TILE_SCAN_MIXEDAPI,
        exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, dw.min.y - 1, &cinfo));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_read_scanline_chunk_info (f, 0, dw.max.y + 1, &cinfo));
    EXRCORE_TEST_RVAL (exr_read_scanline_chunk_info (f, 0, dw.min.y, &cinfo));

    uint64_t pchunksz = 0;
    EXRCORE_TEST_RVAL (exr_get_chunk_unpacked_size (f, 0, &pchunksz));
    EXRCORE_TEST (cinfo.type == EXR_STORAGE_SCANLINE);
    EXRCORE_TEST (cinfo.compression == EXR_COMPRESSION_NONE);
    EXRCORE_TEST (cinfo.packed_size == pchunksz);
    EXRCORE_TEST (cinfo.unpacked_size == pchunksz);
    EXRCORE_TEST (cinfo.sample_count_data_offset == 0);
    EXRCORE_TEST (cinfo.sample_count_table_size == 0);

    exr_decode_pipeline_t decoder;
    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));

    EXRCORE_TEST (decoder.channel_count == 2);
    EXRCORE_TEST (!strcmp (decoder.channels[0].channel_name, "R"));
    EXRCORE_TEST (decoder.channels[0].bytes_per_element == 2);
    EXRCORE_TEST (decoder.channels[0].data_type == EXR_PIXEL_HALF);
    EXRCORE_TEST (decoder.channels[0].width == 178);
    EXRCORE_TEST (decoder.channels[0].height == 1);
    EXRCORE_TEST (decoder.channels[0].x_samples == 1);
    EXRCORE_TEST (decoder.channels[0].y_samples == 1);
    EXRCORE_TEST (!strcmp (decoder.channels[1].channel_name, "Z"));
    EXRCORE_TEST (decoder.channels[1].bytes_per_element == 4);
    EXRCORE_TEST (decoder.channels[1].data_type == EXR_PIXEL_FLOAT);
    EXRCORE_TEST (decoder.channels[1].width == 178);
    EXRCORE_TEST (decoder.channels[1].height == 1);
    EXRCORE_TEST (decoder.channels[1].x_samples == 1);
    EXRCORE_TEST (decoder.channels[1].y_samples == 1);

    std::unique_ptr<uint8_t[]> rptr{new uint8_t[178 * 2]};
    std::unique_ptr<uint8_t[]> zptr{new uint8_t[178 * 4]};
    memset (rptr.get (), -1, 178 * 2);
    memset (zptr.get (), -1, 178 * 4);
    decoder.channels[0].decode_to_ptr     = rptr.get ();
    decoder.channels[0].user_pixel_stride = 2;
    decoder.channels[0].user_line_stride  = 2 * 178;
    decoder.channels[1].decode_to_ptr     = zptr.get ();
    decoder.channels[1].user_pixel_stride = 4;
    decoder.channels[1].user_line_stride  = 4 * 178;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    // it is compression: none
    EXRCORE_TEST (decoder.packed_buffer == NULL);
    // it is compression: none
    EXRCORE_TEST (decoder.unpacked_buffer == NULL);
    /* TODO: add actual comparison against C++ library */
    const uint16_t* curr = reinterpret_cast<const uint16_t*> (rptr.get ());
    const float*    curz = reinterpret_cast<const float*> (zptr.get ());
    EXRCORE_TEST (*curr == 0);
    EXRCORE_TEST (fabsf (*curz - 0.101991f) < 0.000001f);

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_initialize (f, 0, &cinfo, &decoder));
    rptr.reset (new uint8_t[178 * 4]);
    decoder.channels[0].decode_to_ptr          = rptr.get ();
    decoder.channels[0].user_pixel_stride      = 4;
    decoder.channels[0].user_line_stride       = 4 * 178;
    decoder.channels[0].user_bytes_per_element = 4;
    decoder.channels[0].user_data_type         = EXR_PIXEL_FLOAT;
    decoder.channels[1].decode_to_ptr          = zptr.get ();
    decoder.channels[1].user_pixel_stride      = 4;
    decoder.channels[1].user_line_stride       = 4 * 178;

    EXRCORE_TEST_RVAL (exr_decoding_choose_default_routines (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));

    exr_finish (&f);
}